

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>::duplicate
          (holder<std::pair<cs_impl::any,_cs_impl::any>_> *this)

{
  proxy *ppVar1;
  baseHolder *pbVar2;
  
  if ((DAT_0025a0e8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<bool>::allocator + DAT_0025a0e8 * 8);
    DAT_0025a0e8 = DAT_0025a0e8 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_00250478;
  ppVar1 = (this->mDat).first.mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  pbVar2[1]._vptr_baseHolder = (_func_int **)ppVar1;
  ppVar1 = (this->mDat).second.mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  pbVar2[2]._vptr_baseHolder = (_func_int **)ppVar1;
  return pbVar2;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}